

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwitchingFunction.cpp
# Opt level: O2

void __thiscall
OpenMD::SwitchingFunction::setSwitchType(SwitchingFunction *this,SwitchingFunctionType sft)

{
  __shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  if (sft < 2) {
    if (this->haveSpline_ == true) {
      std::make_shared<OpenMD::CubicSpline>();
      std::__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->switchSpline_).
                  super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>,&local_20);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
      setSwitch(this,this->rin_,this->rout_);
    }
    return;
  }
  memcpy(&painCave,"SwitchingFunction::setSwitchType was given unknown function type\n",0x42);
  painCave.isFatal = 1;
  painCave.severity = 1;
  simError();
  return;
}

Assistant:

void SwitchingFunction::setSwitchType(SwitchingFunctionType sft) {
    if ((sft == fifth_order_poly) || (sft == cubic)) {
      if (haveSpline_) {
        switchSpline_ = std::make_shared<CubicSpline>();
        setSwitch(rin_, rout_);
      }
    } else {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "SwitchingFunction::setSwitchType was given unknown function type\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }
  }